

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O1

void mserialize::detail::visit_arithmetic<binlog::ToStringVisitor,binlog::Range>
               (char tag,ToStringVisitor *visitor,Range *istream)

{
  longdouble v;
  int8_t v_00;
  byte bVar1;
  char c;
  uint8_t v_01;
  double *pdVar2;
  uint64_t *puVar3;
  int64_t *piVar4;
  runtime_error *this;
  int iVar5;
  undefined7 in_register_00000039;
  uint64_t v_02;
  int64_t v_03;
  double v_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar5 = (int)CONCAT71(in_register_00000039,tag);
  if (iVar5 < 0x62) {
    if (0x48 < iVar5) {
      if (iVar5 == 0x49) {
        binlog::Range::throw_if_overflow(istream,4);
        v_02 = (uint64_t)*(uint *)istream->_begin;
        puVar3 = (uint64_t *)((long)istream->_begin + 4);
      }
      else if (iVar5 == 0x4c) {
        binlog::Range::throw_if_overflow(istream,8);
        v_02 = *(uint64_t *)istream->_begin;
        puVar3 = (uint64_t *)((long)istream->_begin + 8);
      }
      else {
        if (iVar5 != 0x53) goto switchD_00108734_caseD_65;
        binlog::Range::throw_if_overflow(istream,2);
        v_02 = (uint64_t)*(ushort *)istream->_begin;
        puVar3 = (uint64_t *)((long)istream->_begin + 2);
      }
      istream->_begin = (char *)puVar3;
      binlog::ToStringVisitor::comma(visitor);
      binlog::detail::OstreamBuffer::writeUnsigned(visitor->_out,v_02);
      return;
    }
    if (iVar5 == 0x42) {
      binlog::Range::throw_if_overflow(istream,1);
      v_01 = *istream->_begin;
      istream->_begin = istream->_begin + 1;
      binlog::ToStringVisitor::visit(visitor,v_01);
      return;
    }
    if (iVar5 == 0x44) {
      binlog::Range::throw_if_overflow(istream,0x10);
      v = *(longdouble *)istream->_begin;
      istream->_begin = (char *)((long)istream->_begin + 0x10);
      binlog::ToStringVisitor::comma(visitor);
      binlog::detail::OstreamBuffer::operator<<(visitor->_out,v);
      return;
    }
    goto switchD_00108734_caseD_65;
  }
  switch(iVar5) {
  case 0x62:
    binlog::Range::throw_if_overflow(istream,1);
    v_00 = *istream->_begin;
    istream->_begin = istream->_begin + 1;
    binlog::ToStringVisitor::visit(visitor,v_00);
    return;
  case 99:
    binlog::Range::throw_if_overflow(istream,1);
    c = *istream->_begin;
    istream->_begin = istream->_begin + 1;
    binlog::ToStringVisitor::comma(visitor);
    binlog::detail::OstreamBuffer::put(visitor->_out,c);
    return;
  case 100:
    binlog::Range::throw_if_overflow(istream,8);
    v_04 = *(double *)istream->_begin;
    pdVar2 = (double *)((long)istream->_begin + 8);
    break;
  case 0x66:
    binlog::Range::throw_if_overflow(istream,4);
    v_04 = (double)*(float *)istream->_begin;
    pdVar2 = (double *)((long)istream->_begin + 4);
    break;
  case 0x69:
    binlog::Range::throw_if_overflow(istream,4);
    v_03 = (int64_t)*(int *)istream->_begin;
    piVar4 = (int64_t *)((long)istream->_begin + 4);
    goto LAB_001089b9;
  case 0x6c:
    binlog::Range::throw_if_overflow(istream,8);
    v_03 = *(int64_t *)istream->_begin;
    piVar4 = (int64_t *)((long)istream->_begin + 8);
LAB_001089b9:
    istream->_begin = (char *)piVar4;
    binlog::ToStringVisitor::comma(visitor);
    binlog::detail::OstreamBuffer::writeSigned(visitor->_out,v_03);
    return;
  default:
    if (iVar5 == 0x73) {
      binlog::Range::throw_if_overflow(istream,2);
      v_03 = (int64_t)*(short *)istream->_begin;
      piVar4 = (int64_t *)((long)istream->_begin + 2);
      goto LAB_001089b9;
    }
    if (iVar5 == 0x79) {
      binlog::Range::throw_if_overflow(istream,1);
      bVar1 = *istream->_begin;
      istream->_begin = istream->_begin + 1;
      binlog::ToStringVisitor::comma(visitor);
      binlog::detail::OstreamBuffer::operator<<(visitor->_out,(bool)(bVar1 & 1));
      return;
    }
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
switchD_00108734_caseD_65:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid arithmetic tag: ","");
    std::operator+(&local_48,&local_68,tag);
    std::runtime_error::runtime_error(this,(string *)&local_48);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  istream->_begin = (char *)pdVar2;
  binlog::ToStringVisitor::comma(visitor);
  binlog::detail::OstreamBuffer::operator<<(visitor->_out,v_04);
  return;
}

Assistant:

void visit_arithmetic(char tag, Visitor& visitor, InputStream& istream)
{
  switch(tag)
  {
  case 'y': bool y; mserialize::deserialize(y, istream); visitor.visit(y); break;
  case 'c': char c; mserialize::deserialize(c, istream); visitor.visit(c); break;

  case 'b': std::int8_t  b; mserialize::deserialize(b, istream); visitor.visit(b); break;
  case 's': std::int16_t s; mserialize::deserialize(s, istream); visitor.visit(s); break;
  case 'i': std::int32_t i; mserialize::deserialize(i, istream); visitor.visit(i); break;
  case 'l': std::int64_t l; mserialize::deserialize(l, istream); visitor.visit(l); break;

  case 'B': std::uint8_t  B; mserialize::deserialize(B, istream); visitor.visit(B); break;
  case 'S': std::uint16_t S; mserialize::deserialize(S, istream); visitor.visit(S); break;
  case 'I': std::uint32_t I; mserialize::deserialize(I, istream); visitor.visit(I); break;
  case 'L': std::uint64_t L; mserialize::deserialize(L, istream); visitor.visit(L); break;

  case 'f': float f;       mserialize::deserialize(f, istream); visitor.visit(f); break;
  case 'd': double d;      mserialize::deserialize(d, istream); visitor.visit(d); break;
  case 'D': long double D; mserialize::deserialize(D, istream); visitor.visit(D); break;
  default: throw std::runtime_error(std::string("Invalid arithmetic tag: ") + tag); break;
  }
}